

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcombobox.cpp
# Opt level: O2

void __thiscall
QComboBoxPrivate::dataChanged(QComboBoxPrivate *this,QModelIndex *topLeft,QModelIndex *bottomRight)

{
  QWidget *this_00;
  bool bVar1;
  int iVar2;
  long in_FS_OFFSET;
  QAccessibleValueChangeEvent event;
  QArrayDataPointer<char16_t> local_b8;
  QVariant local_98;
  QModelIndex local_78;
  undefined1 *puStack_60;
  undefined1 *local_58;
  undefined1 *puStack_50;
  undefined1 *local_48;
  undefined1 *puStack_40;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  if ((this->field_0x34c & 8) == 0) {
    this_00 = *(QWidget **)&(this->super_QWidgetPrivate).field_0x8;
    QModelIndex::parent(&local_78,topLeft);
    bVar1 = ::operator!=(&local_78,&this->root);
    if (!bVar1) {
      if (this->sizeAdjustPolicy == AdjustToContents) {
        (this->sizeHint).wd = -1;
        (this->sizeHint).ht = -1;
        adjustComboBoxSize(this);
        QWidget::updateGeometry(this_00);
      }
      iVar2 = QPersistentModelIndex::row();
      if (topLeft->r <= iVar2) {
        iVar2 = QPersistentModelIndex::row();
        if (iVar2 <= bottomRight->r) {
          local_b8.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
          local_b8.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
          local_b8.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
          iVar2 = QPersistentModelIndex::row();
          QComboBox::itemText((QString *)&local_b8,(QComboBox *)this_00,iVar2);
          if (this->lineEdit == (QLineEdit *)0x0) {
            updateCurrentText(this,(QString *)&local_b8);
          }
          else {
            QLineEdit::setText(this->lineEdit,(QString *)&local_b8);
            updateLineEditGeometry(this);
          }
          QWidget::update(this_00);
          local_48 = &DAT_aaaaaaaaaaaaaaaa;
          puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
          local_58 = &DAT_aaaaaaaaaaaaaaaa;
          puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
          local_78.m.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
          puStack_60 = &DAT_aaaaaaaaaaaaaaaa;
          local_78._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
          local_78.i = (quintptr)&DAT_aaaaaaaaaaaaaaaa;
          ::QVariant::QVariant(&local_98,(QString *)&local_b8);
          QAccessibleValueChangeEvent::QAccessibleValueChangeEvent
                    ((QAccessibleValueChangeEvent *)&local_78,&this_00->super_QObject,&local_98);
          ::QVariant::~QVariant(&local_98);
          QAccessible::updateAccessibility((QAccessibleEvent *)&local_78);
          QAccessibleValueChangeEvent::~QAccessibleValueChangeEvent
                    ((QAccessibleValueChangeEvent *)&local_78);
          QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_b8);
        }
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QComboBoxPrivate::dataChanged(const QModelIndex &topLeft, const QModelIndex &bottomRight)
{
    Q_Q(QComboBox);
    if (inserting || topLeft.parent() != root)
        return;

    if (sizeAdjustPolicy == QComboBox::AdjustToContents) {
        sizeHint = QSize();
        adjustComboBoxSize();
        q->updateGeometry();
    }

    if (currentIndex.row() >= topLeft.row() && currentIndex.row() <= bottomRight.row()) {
        const QString text = q->itemText(currentIndex.row());
        if (lineEdit) {
            lineEdit->setText(text);
            updateLineEditGeometry();
        } else {
            updateCurrentText(text);
        }
        q->update();
#if QT_CONFIG(accessibility)
        QAccessibleValueChangeEvent event(q, text);
        QAccessible::updateAccessibility(&event);
#endif
    }
}